

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool print_value(cJSON *item,printbuffer *output_buffer)

{
  double dVar1;
  byte bVar2;
  uchar uVar3;
  long lVar4;
  cJSON_bool cVar5;
  uint uVar6;
  cJSON_bool cVar7;
  int iVar8;
  uchar *puVar9;
  size_t sVar10;
  lconv *plVar11;
  ulong uVar12;
  ulong uVar13;
  uchar uVar14;
  size_t sVar15;
  long lVar16;
  cJSON *pcVar17;
  long in_FS_OFFSET;
  double dVar18;
  double local_60;
  undefined8 local_58;
  uchar number_buffer [26];
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  cVar5 = 0;
  cVar7 = 0;
  if (output_buffer != (printbuffer *)0x0 && item != (cJSON *)0x0) {
    bVar2 = (byte)item->type;
    cVar7 = cVar5;
    if (bVar2 < 0x10) {
      switch(bVar2) {
      case 1:
        puVar9 = ensure(output_buffer,6);
        if (puVar9 != (uchar *)0x0) {
          builtin_memcpy(puVar9,"false",6);
LAB_00103298:
          cVar7 = 1;
        }
        break;
      case 2:
        puVar9 = ensure(output_buffer,5);
        if (puVar9 != (uchar *)0x0) {
          builtin_memcpy(puVar9,"true",5);
          goto LAB_00103298;
        }
        break;
      case 4:
        puVar9 = ensure(output_buffer,5);
        if (puVar9 != (uchar *)0x0) {
          builtin_memcpy(puVar9,"null",5);
          goto LAB_00103298;
        }
        break;
      case 8:
        dVar1 = item->valuedouble;
        number_buffer[8] = '\0';
        number_buffer[9] = '\0';
        number_buffer[10] = '\0';
        number_buffer[0xb] = '\0';
        number_buffer[0xc] = '\0';
        number_buffer[0xd] = '\0';
        number_buffer[0xe] = '\0';
        number_buffer[0xf] = '\0';
        number_buffer[0x10] = '\0';
        number_buffer[0x11] = '\0';
        local_58 = 0;
        number_buffer[0] = '\0';
        number_buffer[1] = '\0';
        number_buffer[2] = '\0';
        number_buffer[3] = '\0';
        number_buffer[4] = '\0';
        number_buffer[5] = '\0';
        number_buffer[6] = '\0';
        number_buffer[7] = '\0';
        plVar11 = localeconv();
        uVar3 = *plVar11->decimal_point;
        local_60 = 0.0;
        if (NAN(dVar1 - dVar1) || NAN(dVar1)) {
          uVar13 = (ulong)local_58 >> 0x20;
          local_58 = CONCAT44((uint)uVar13 & 0xffffff00,0x6c6c756e);
          uVar6 = 4;
LAB_0010320b:
          uVar13 = (ulong)uVar6;
          puVar9 = ensure(output_buffer,uVar13 + 1);
          if (puVar9 != (uchar *)0x0) {
            if (uVar13 != 0) {
              uVar12 = 0;
              do {
                uVar14 = number_buffer[uVar12 - 8];
                if (number_buffer[uVar12 - 8] == uVar3) {
                  uVar14 = '.';
                }
                puVar9[uVar12] = uVar14;
                uVar12 = uVar12 + 1;
              } while (uVar13 != uVar12);
            }
            puVar9[uVar13] = '\0';
            output_buffer->offset = output_buffer->offset + uVar13;
            goto LAB_00103298;
          }
        }
        else {
          if ((dVar1 != (double)item->valueint) || (NAN(dVar1) || NAN((double)item->valueint))) {
            uVar6 = sprintf((char *)&local_58,"%1.15g");
            iVar8 = __isoc99_sscanf(&local_58,"%lg",&local_60);
            if (iVar8 == 1) {
              dVar18 = ABS(local_60);
              if (ABS(local_60) <= ABS(dVar1)) {
                dVar18 = ABS(dVar1);
              }
              if (ABS(local_60 - dVar1) <= dVar18 * 2.220446049250313e-16) goto LAB_00103205;
            }
            uVar6 = sprintf((char *)&local_58,"%1.17g");
          }
          else {
            uVar6 = sprintf((char *)&local_58,"%d");
          }
LAB_00103205:
          if (uVar6 < 0x1a) goto LAB_0010320b;
        }
LAB_0010324d:
        cVar7 = 0;
      }
    }
    else if (bVar2 < 0x40) {
      if (bVar2 == 0x10) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
          cVar7 = print_string_ptr((uchar *)item->valuestring,output_buffer);
          return cVar7;
        }
        goto LAB_001032bd;
      }
      if (bVar2 == 0x20) {
        pcVar17 = item->child;
        puVar9 = ensure(output_buffer,1);
        if (puVar9 != (uchar *)0x0) {
          *puVar9 = '[';
          output_buffer->offset = output_buffer->offset + 1;
          output_buffer->depth = output_buffer->depth + 1;
          for (; pcVar17 != (cJSON *)0x0; pcVar17 = pcVar17->next) {
            cVar5 = print_value(pcVar17,output_buffer);
            if (cVar5 == 0) goto switchD_00102da2_caseD_3;
            if (output_buffer->buffer != (uchar *)0x0) {
              sVar15 = output_buffer->offset;
              sVar10 = strlen((char *)(output_buffer->buffer + sVar15));
              output_buffer->offset = sVar10 + sVar15;
            }
            if (pcVar17->next == (cJSON *)0x0) break;
            uVar13 = (ulong)(output_buffer->format == 0);
            puVar9 = ensure(output_buffer,uVar13 ^ 3);
            if (puVar9 == (uchar *)0x0) goto switchD_00102da2_caseD_3;
            *puVar9 = ',';
            if (output_buffer->format == 0) {
              puVar9 = puVar9 + 1;
            }
            else {
              puVar9[1] = ' ';
              puVar9 = puVar9 + 2;
            }
            *puVar9 = '\0';
            output_buffer->offset = output_buffer->offset + (2 - uVar13);
          }
          puVar9 = ensure(output_buffer,2);
          cVar7 = 0;
          if (puVar9 != (uchar *)0x0) {
            puVar9[0] = ']';
            puVar9[1] = '\0';
            goto LAB_00103294;
          }
        }
      }
    }
    else if (bVar2 == 0x40) {
      pcVar17 = item->child;
      uVar13 = (ulong)(output_buffer->format == 0);
      puVar9 = ensure(output_buffer,uVar13 ^ 3);
      if (puVar9 != (uchar *)0x0) {
        *puVar9 = '{';
        output_buffer->depth = output_buffer->depth + 1;
        if (output_buffer->format != 0) {
          puVar9[1] = '\n';
        }
        output_buffer->offset = output_buffer->offset + (2 - uVar13);
        if (pcVar17 != (cJSON *)0x0) {
          cVar7 = 0;
          do {
            if (output_buffer->format != 0) {
              puVar9 = ensure(output_buffer,output_buffer->depth);
              if (puVar9 == (uchar *)0x0) goto LAB_0010324d;
              if (output_buffer->depth == 0) {
                uVar13 = 0;
              }
              else {
                uVar12 = 0;
                do {
                  puVar9[uVar12] = '\t';
                  uVar12 = uVar12 + 1;
                  uVar13 = output_buffer->depth;
                } while (uVar12 < uVar13);
              }
              output_buffer->offset = output_buffer->offset + uVar13;
            }
            cVar5 = print_string_ptr((uchar *)pcVar17->string,output_buffer);
            if (cVar5 == 0) goto switchD_00102da2_caseD_3;
            if (output_buffer->buffer != (uchar *)0x0) {
              sVar15 = output_buffer->offset;
              sVar10 = strlen((char *)(output_buffer->buffer + sVar15));
              output_buffer->offset = sVar10 + sVar15;
            }
            sVar15 = 2 - (ulong)(output_buffer->format == 0);
            puVar9 = ensure(output_buffer,sVar15);
            if (puVar9 == (uchar *)0x0) goto switchD_00102da2_caseD_3;
            *puVar9 = ':';
            if (output_buffer->format != 0) {
              puVar9[1] = '\t';
            }
            output_buffer->offset = output_buffer->offset + sVar15;
            cVar5 = print_value(pcVar17,output_buffer);
            if (cVar5 == 0) goto switchD_00102da2_caseD_3;
            if (output_buffer->buffer != (uchar *)0x0) {
              sVar15 = output_buffer->offset;
              sVar10 = strlen((char *)(output_buffer->buffer + sVar15));
              output_buffer->offset = sVar10 + sVar15;
            }
            lVar16 = ((ulong)(pcVar17->next != (cJSON *)0x0) + 1) -
                     (ulong)(output_buffer->format == 0);
            puVar9 = ensure(output_buffer,lVar16 + 1);
            if (puVar9 == (uchar *)0x0) goto switchD_00102da2_caseD_3;
            if (pcVar17->next != (cJSON *)0x0) {
              *puVar9 = ',';
              puVar9 = puVar9 + 1;
            }
            if (output_buffer->format != 0) {
              *puVar9 = '\n';
              puVar9 = puVar9 + 1;
            }
            *puVar9 = '\0';
            output_buffer->offset = output_buffer->offset + lVar16;
            pcVar17 = pcVar17->next;
          } while (pcVar17 != (cJSON *)0x0);
        }
        if (output_buffer->format == 0) {
          sVar15 = 2;
        }
        else {
          sVar15 = output_buffer->depth + 1;
        }
        puVar9 = ensure(output_buffer,sVar15);
        cVar7 = 0;
        if (puVar9 != (uchar *)0x0) {
          if ((output_buffer->format != 0) && (output_buffer->depth != 1)) {
            uVar13 = 0;
            do {
              puVar9[uVar13] = '\t';
              uVar13 = uVar13 + 1;
            } while (uVar13 < output_buffer->depth - 1);
            puVar9 = puVar9 + uVar13;
          }
          puVar9[0] = '}';
          puVar9[1] = '\0';
LAB_00103294:
          output_buffer->depth = output_buffer->depth - 1;
          goto LAB_00103298;
        }
      }
    }
    else if ((bVar2 == 0x80) && (item->valuestring != (char *)0x0)) {
      sVar10 = strlen(item->valuestring);
      puVar9 = ensure(output_buffer,sVar10 + 1);
      if (puVar9 != (uchar *)0x0) {
        memcpy(puVar9,item->valuestring,sVar10 + 1);
        goto LAB_00103298;
      }
    }
  }
switchD_00102da2_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return cVar7;
  }
LAB_001032bd:
  __stack_chk_fail();
}

Assistant:

static cJSON_bool print_value(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output = NULL;

    if ((item == NULL) || (output_buffer == NULL))
    {
        return false;
    }

    switch ((item->type) & 0xFF)
    {
        case cJSON_NULL:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "null");
            return true;

        case cJSON_False:
            output = ensure(output_buffer, 6);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "false");
            return true;

        case cJSON_True:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "true");
            return true;

        case cJSON_Number:
            return print_number(item, output_buffer);

        case cJSON_Raw:
        {
            size_t raw_length = 0;
            if (item->valuestring == NULL)
            {
                return false;
            }

            raw_length = strlen(item->valuestring) + sizeof("");
            output = ensure(output_buffer, raw_length);
            if (output == NULL)
            {
                return false;
            }
            memcpy(output, item->valuestring, raw_length);
            return true;
        }

        case cJSON_String:
            return print_string(item, output_buffer);

        case cJSON_Array:
            return print_array(item, output_buffer);

        case cJSON_Object:
            return print_object(item, output_buffer);

        default:
            return false;
    }
}